

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void * __thiscall ON_FixedSizePool::Element(ON_FixedSizePool *this,size_t element_index)

{
  char *pcVar1;
  size_t block_count;
  char *next_block;
  char *block_end;
  char *block;
  size_t element_index_local;
  ON_FixedSizePool *this_local;
  
  if (element_index < this->m_total_element_count) {
    block_end = (char *)this->m_first_block;
    block = (char *)element_index;
    while (block_end != (char *)0x0) {
      if (block_end == (char *)this->m_al_block) {
        block_count = 0;
        next_block = (char *)this->m_al_element_array;
      }
      else {
        block_count = *(size_t *)block_end;
        next_block = *(char **)(block_end + 8);
      }
      block_end = block_end + 0x10;
      pcVar1 = (char *)((ulong)((long)next_block - (long)block_end) / this->m_sizeof_element);
      if (block < pcVar1) {
        return block_end + (long)block * this->m_sizeof_element;
      }
      block = block + -(long)pcVar1;
      block_end = (char *)block_count;
    }
  }
  return (void *)0x0;
}

Assistant:

void* ON_FixedSizePool::Element(size_t element_index) const
{
  if (element_index < (size_t)m_total_element_count)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    size_t block_count;

    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        next_block = nullptr;

        // for debugging
        // block += sizeof(void*);
        // block_end = *((const char**)(block));
        // block += sizeof(void*);

        block_end = (const char*)m_al_element_array;
        block += 2*sizeof(void*);
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      block_count = (block_end - block) / m_sizeof_element;
      if (element_index < block_count)
        return ((void*)(block + element_index*m_sizeof_element));
      element_index -= block_count;
    }
  }

  return nullptr;
}